

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

bool __thiscall
re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  ushort uVar1;
  uint16 uVar2;
  int j_1;
  int iVar3;
  Regexp *pRVar4;
  int j_2;
  char *str;
  uint uVar5;
  ulong uVar6;
  int j;
  long lVar7;
  long lVar8;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar9;
  Rune r;
  char buf [4];
  
  prefix->_M_string_length = 0;
  *(prefix->_M_dataplus)._M_p = '\0';
  *foldcase = false;
  *suffix = (Regexp *)0x0;
  if (this->op_ == '\x05') {
    if ((ulong)this->nsub_ < 2) {
      paVar9 = &this->field_5;
    }
    else {
      paVar9 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    lVar8 = -8;
    for (uVar6 = 1; uVar6 - this->nsub_ != 1; uVar6 = uVar6 + 1) {
      if ((paVar9[uVar6 - 1].subone_)->op_ != '\x12') {
        if (uVar6 == 1) {
          return false;
        }
        pRVar4 = paVar9[uVar6 - 1].subone_;
        if (pRVar4->op_ == '\x03') {
          if ((byte)((pRVar4->field_7).field_0.max_ < 0x80 |
                    ((byte)pRVar4->parse_flags_ & 0x20) >> 5) == 1) {
            std::__cxx11::string::append((ulong)prefix,'\x01');
          }
          else {
            runetochar(buf,&(pRVar4->field_7).rune_);
            std::__cxx11::string::append((char *)prefix,(ulong)buf);
          }
        }
        else {
          if (pRVar4->op_ != '\x04') {
            return false;
          }
          if ((pRVar4->parse_flags_ & 0x20) == 0) {
            std::__cxx11::string::resize((ulong)prefix);
            str = (prefix->_M_dataplus)._M_p;
            for (lVar7 = 0; lVar7 < (pRVar4->field_7).field_0.max_; lVar7 = lVar7 + 1) {
              r = *(int *)((long)&(((pRVar4->field_7).field_1.name_)->_M_dataplus)._M_p + lVar7 * 4)
              ;
              if (r < 0x80) {
                *str = (char)r;
                str = str + 1;
              }
              else {
                iVar3 = runetochar(str,&r);
                str = str + iVar3;
              }
            }
            std::__cxx11::string::resize((ulong)prefix);
          }
          else {
            std::__cxx11::string::resize((ulong)prefix);
            for (lVar7 = 0; lVar7 < (pRVar4->field_7).field_0.max_; lVar7 = lVar7 + 1) {
              (prefix->_M_dataplus)._M_p[lVar7] =
                   *(char *)((long)&(((pRVar4->field_7).field_1.name_)->_M_dataplus)._M_p +
                            lVar7 * 4);
            }
          }
        }
        *foldcase = (bool)((byte)(paVar9[uVar6 - 1].subone_)->parse_flags_ & 1);
        uVar1 = this->nsub_;
        uVar5 = (uint)uVar6;
        if (uVar5 < uVar1) {
          for (; uVar6 < uVar1; uVar6 = uVar6 + 1) {
            Incref(paVar9[uVar6].subone_);
            uVar1 = this->nsub_;
          }
          pRVar4 = Concat((Regexp **)((long)paVar9 - lVar8),uVar1 - uVar5,(uint)this->parse_flags_);
        }
        else {
          pRVar4 = (Regexp *)operator_new(0x28);
          uVar2 = this->parse_flags_;
          pRVar4->op_ = '\x02';
          pRVar4->simple_ = '\0';
          pRVar4->parse_flags_ = uVar2;
          pRVar4->ref_ = 1;
          *(undefined8 *)((long)&pRVar4->down_ + 6) = 0;
          *(undefined8 *)((long)&(pRVar4->field_7).field_3.cc_ + 6) = 0;
          *(undefined8 *)&pRVar4->nsub_ = 0;
          *(undefined8 *)((long)&pRVar4->field_5 + 6) = 0;
          *(undefined2 *)((long)&pRVar4->field_7 + 0xe) = 0;
        }
        *suffix = pRVar4;
        return true;
      }
      lVar8 = lVar8 + -8;
    }
  }
  return false;
}

Assistant:

bool Regexp::RequiredPrefix(string *prefix, bool *foldcase, Regexp** suffix) {
  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;
  if (op_ != kRegexpConcat)
    return false;

  // Some number of anchors, then a literal or concatenation.
  int i = 0;
  Regexp** sub = this->sub();
  while (i < nsub_ && sub[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;

  Regexp* re = sub[i];
  switch (re->op_) {
    default:
      return false;

    case kRegexpLiteralString:
      // Convert to string in proper encoding.
      if (re->parse_flags() & Latin1) {
        prefix->resize(re->nrunes_);
        for (int j = 0; j < re->nrunes_; j++)
          (*prefix)[j] = static_cast<char>(re->runes_[j]);
      } else {
        // Convert to UTF-8 in place.
        // Assume worst-case space and then trim.
        prefix->resize(re->nrunes_ * UTFmax);
        char *p = &(*prefix)[0];
        for (int j = 0; j < re->nrunes_; j++) {
          Rune r = re->runes_[j];
          if (r < Runeself)
            *p++ = static_cast<char>(r);
          else
            p += runetochar(p, &r);
        }
        prefix->resize(p - &(*prefix)[0]);
      }
      break;

    case kRegexpLiteral:
      if ((re->parse_flags() & Latin1) || re->rune_ < Runeself) {
        prefix->append(1, static_cast<char>(re->rune_));
      } else {
        char buf[UTFmax];
        prefix->append(buf, runetochar(buf, &re->rune_));
      }
      break;
  }
  *foldcase = (sub[i]->parse_flags() & FoldCase) != 0;
  i++;

  // The rest.
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub[j]->Incref();
    re = Concat(sub + i, nsub_ - i, parse_flags());
  } else {
    re = new Regexp(kRegexpEmptyMatch, parse_flags());
  }
  *suffix = re;
  return true;
}